

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTruth.c
# Opt level: O2

int If_CutComputeTruth(If_Man_t *p,If_Cut_t *pCut,If_Cut_t *pCut0,If_Cut_t *pCut1,int fCompl0,
                      int fCompl1)

{
  If_Cut_t *pCut_00;
  Vec_Mem_t *pVVar1;
  word *pOut;
  word *pOut_00;
  word *pOut_01;
  Vec_Wec_t *pVVar2;
  Vec_Int_t *p_00;
  undefined1 *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int Entry;
  word *pIn;
  word *pIn_00;
  Vec_Int_t *pVVar7;
  uint uVar8;
  uint uVar9;
  int i;
  Vec_Int_t *p_01;
  int local_70;
  
  pVVar1 = p->vTtMem[(byte)pCut0->field_0x1f];
  iVar4 = Abc_Lit2Var(pCut0->iCutFunc);
  pIn = Vec_MemReadEntry(pVVar1,iVar4);
  pVVar1 = p->vTtMem[(byte)pCut1->field_0x1f];
  iVar4 = Abc_Lit2Var(pCut1->iCutFunc);
  pIn_00 = Vec_MemReadEntry(pVVar1,iVar4);
  pOut = (word *)p->puTemp[0];
  pOut_00 = (word *)p->puTemp[1];
  pOut_01 = (word *)p->puTemp[2];
  uVar9 = *(uint *)&pCut0->field_0x1c;
  iVar4 = p->nTruth6Words[uVar9 >> 0x18];
  uVar5 = Abc_LitIsCompl(pCut0->iCutFunc);
  Abc_TtCopy(pOut,pIn,iVar4,fCompl0 ^ uVar5 ^ uVar9 >> 0xc & 1);
  uVar9 = *(uint *)&pCut1->field_0x1c;
  iVar4 = p->nTruth6Words[uVar9 >> 0x18];
  uVar5 = Abc_LitIsCompl(pCut1->iCutFunc);
  Abc_TtCopy(pOut_00,pIn_00,iVar4,fCompl1 ^ uVar5 ^ uVar9 >> 0xc & 1);
  Abc_TtStretch6(pOut,(uint)(byte)pCut0->field_0x1f,(uint)(byte)pCut->field_0x1f);
  Abc_TtStretch6(pOut_00,(uint)(byte)pCut1->field_0x1f,(uint)(byte)pCut->field_0x1f);
  uVar9 = *(uint *)&pCut->field_0x1c >> 0x18;
  pCut_00 = pCut + 1;
  Abc_TtExpand(pOut,uVar9,(int *)(pCut0 + 1),(uint)(byte)pCut0->field_0x1f,(int *)pCut_00,uVar9);
  uVar9 = *(uint *)&pCut->field_0x1c >> 0x18;
  Abc_TtExpand(pOut_00,uVar9,(int *)(pCut1 + 1),(uint)(byte)pCut1->field_0x1f,(int *)pCut_00,uVar9);
  uVar5 = (uint)*pOut_00 & (uint)*pOut & 1;
  Abc_TtAnd(pOut_01,pOut,pOut_00,p->nTruth6Words[(byte)pCut->field_0x1f],uVar5);
  local_70 = 0;
  uVar9 = *(uint *)&pCut->field_0x1c;
  if (p->pPars->fCutMin != 0) {
    uVar8 = uVar9 >> 0x18;
    if (((*(uint *)&pCut1->field_0x1c < 0x1000000) || (*(uint *)&pCut0->field_0x1c < 0x1000000)) ||
       (uVar8 < (*(uint *)&pCut1->field_0x1c >> 0x18) + (*(uint *)&pCut0->field_0x1c >> 0x18))) {
      iVar4 = Abc_TtMinBase(pOut_01,(int *)pCut_00,uVar8,uVar8);
      uVar9 = *(uint *)&pCut->field_0x1c;
      if (iVar4 < (int)(uVar9 >> 0x18)) {
        uVar9 = uVar9 & 0xffffff | iVar4 << 0x18;
        *(uint *)&pCut->field_0x1c = uVar9;
        uVar8 = If_ObjCutSignCompute(pCut);
        pCut->uSign = uVar8;
        local_70 = 1;
      }
    }
  }
  iVar4 = p->vTtMem[uVar9 >> 0x18]->nEntries;
  iVar6 = Vec_MemHashInsert(p->vTtMem[uVar9 >> 0x18],pOut_01);
  iVar6 = Abc_Var2Lit(iVar6,uVar5);
  pCut->iCutFunc = iVar6;
  if ((*pOut_01 & 1) != 0) {
    __assert_fail("(pTruth[0] & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                  ,0x7f,
                  "int If_CutComputeTruth(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *, int, int)"
                 );
  }
  pVVar2 = p->vTtIsops[(byte)pCut->field_0x1f];
  if ((pVVar2 != (Vec_Wec_t *)0x0) && (iVar4 != p->vTtMem[(byte)pCut->field_0x1f]->nEntries)) {
    iVar4 = pVVar2->nSize;
    if (iVar4 == pVVar2->nCap) {
      uVar9 = 0x10;
      if (0xf < iVar4) {
        uVar9 = iVar4 * 2;
      }
      if (iVar4 < (int)uVar9) {
        if (pVVar2->pArray == (Vec_Int_t *)0x0) {
          pVVar7 = (Vec_Int_t *)malloc((ulong)uVar9 << 4);
          iVar6 = iVar4;
        }
        else {
          pVVar7 = (Vec_Int_t *)realloc(pVVar2->pArray,(ulong)uVar9 << 4);
          iVar4 = pVVar2->nSize;
          iVar6 = pVVar2->nCap;
        }
        pVVar2->pArray = pVVar7;
        memset(pVVar7 + iVar6,0,(long)(int)(uVar9 - iVar6) << 4);
        pVVar2->nCap = uVar9;
      }
    }
    uVar9 = iVar4 + 1;
    pVVar2->nSize = uVar9;
    if (iVar4 < 0) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
    }
    pVVar7 = pVVar2->pArray;
    iVar4 = Kit_TruthIsop((uint *)pOut_01,(uint)(byte)pCut->field_0x1f,p->vCover,1);
    if (-1 < iVar4) {
      p_01 = pVVar7 + ((ulong)uVar9 - 1);
      Vec_IntGrow(p_01,p->vCover->nSize);
      p_00 = p->vCover;
      for (iVar6 = 0; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
        Entry = Vec_IntEntry(p_00,iVar6);
        Vec_IntPush(p_01,Entry);
      }
      if (iVar4 != 0) {
        puVar3 = (undefined1 *)((long)&pVVar7[(ulong)uVar9 - 1].nCap + 2);
        *puVar3 = *puVar3 ^ 1;
      }
    }
    if (p->vTtIsops[(byte)pCut->field_0x1f]->nSize != p->vTtMem[(byte)pCut->field_0x1f]->nEntries) {
      __assert_fail("Vec_WecSize(p->vTtIsops[pCut->nLeaves]) == Vec_MemEntryNum(p->vTtMem[pCut->nLeaves])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                    ,0x93,
                    "int If_CutComputeTruth(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *, int, int)"
                   );
    }
  }
  return local_70;
}

Assistant:

int If_CutComputeTruth( If_Man_t * p, If_Cut_t * pCut, If_Cut_t * pCut0, If_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    int fCompl, truthId, nLeavesNew, PrevSize, RetValue = 0;
    word * pTruth0s = Vec_MemReadEntry( p->vTtMem[pCut0->nLeaves], Abc_Lit2Var(pCut0->iCutFunc) );
    word * pTruth1s = Vec_MemReadEntry( p->vTtMem[pCut1->nLeaves], Abc_Lit2Var(pCut1->iCutFunc) );
    word * pTruth0  = (word *)p->puTemp[0];
    word * pTruth1  = (word *)p->puTemp[1];
    word * pTruth   = (word *)p->puTemp[2];
    Abc_TtCopy( pTruth0, pTruth0s, p->nTruth6Words[pCut0->nLeaves], fCompl0 ^ pCut0->fCompl ^ Abc_LitIsCompl(pCut0->iCutFunc) );
    Abc_TtCopy( pTruth1, pTruth1s, p->nTruth6Words[pCut1->nLeaves], fCompl1 ^ pCut1->fCompl ^ Abc_LitIsCompl(pCut1->iCutFunc) );
    Abc_TtStretch6( pTruth0, pCut0->nLeaves, pCut->nLeaves );
    Abc_TtStretch6( pTruth1, pCut1->nLeaves, pCut->nLeaves );
    Abc_TtExpand( pTruth0, pCut->nLeaves, pCut0->pLeaves, pCut0->nLeaves, pCut->pLeaves, pCut->nLeaves );
    Abc_TtExpand( pTruth1, pCut->nLeaves, pCut1->pLeaves, pCut1->nLeaves, pCut->pLeaves, pCut->nLeaves );
    fCompl         = (pTruth0[0] & pTruth1[0] & 1);
    Abc_TtAnd( pTruth, pTruth0, pTruth1, p->nTruth6Words[pCut->nLeaves], fCompl );
    if ( p->pPars->fCutMin && (pCut0->nLeaves + pCut1->nLeaves > pCut->nLeaves || pCut0->nLeaves == 0 || pCut1->nLeaves == 0) )
    {
        nLeavesNew = Abc_TtMinBase( pTruth, pCut->pLeaves, pCut->nLeaves, pCut->nLeaves );
        if ( nLeavesNew < If_CutLeaveNum(pCut) )
        {
            pCut->nLeaves = nLeavesNew;
            pCut->uSign   = If_ObjCutSignCompute( pCut );
            RetValue      = 1;
        }
    }
    PrevSize       = Vec_MemEntryNum( p->vTtMem[pCut->nLeaves] );   
    truthId        = Vec_MemHashInsert( p->vTtMem[pCut->nLeaves], pTruth );
    pCut->iCutFunc = Abc_Var2Lit( truthId, fCompl );
    assert( (pTruth[0] & 1) == 0 );
#ifdef IF_TRY_NEW
    {
        word pCopy[1024];
        char pCanonPerm[16];
        memcpy( pCopy, If_CutTruthW(pCut), sizeof(word) * p->nTruth6Words[pCut->nLeaves] );
        Abc_TtCanonicize( pCopy, pCut->nLeaves, pCanonPerm );
    }
#endif
    if ( p->vTtIsops[pCut->nLeaves] && PrevSize != Vec_MemEntryNum(p->vTtMem[pCut->nLeaves]) )
    {
        Vec_Int_t * vLevel = Vec_WecPushLevel( p->vTtIsops[pCut->nLeaves] );
        fCompl = Kit_TruthIsop( (unsigned *)pTruth, pCut->nLeaves, p->vCover, 1 );
        if ( fCompl >= 0 )
        {
            Vec_IntGrow( vLevel, Vec_IntSize(p->vCover) );
            Vec_IntAppend( vLevel, p->vCover );
            if ( fCompl )
                vLevel->nCap ^= (1<<16); // hack to remember complemented attribute
        }
        assert( Vec_WecSize(p->vTtIsops[pCut->nLeaves]) == Vec_MemEntryNum(p->vTtMem[pCut->nLeaves]) );
    }
    return RetValue;
}